

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall VolumeFile::parseSegment(VolumeFile *this)

{
  bool bVar1;
  uint uVar2;
  reference puVar3;
  VolumeFile *in_RDI;
  uint *offset;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  uint segmentMagic;
  uchar *p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  uint local_1c;
  uchar *local_18;
  bool local_1;
  
  local_18 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13285f);
  bVar1 = needSwapEndian(in_RDI);
  if (bVar1) {
    local_4c = readNextWithByteSwap<unsigned_int,unsigned_char>
                         ((uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  else {
    local_4c = readNext<unsigned_int,unsigned_char>
                         ((uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  local_1c = local_4c;
  if (local_4c == 0x5b74516e) {
    bVar1 = needSwapEndian(in_RDI);
    if (bVar1) {
      local_50 = readNextWithByteSwap<unsigned_int,unsigned_char>
                           ((uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
    }
    else {
      local_50 = readNext<unsigned_int,unsigned_char>
                           ((uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
    }
    in_RDI->m_nameTreeOffset = local_50;
    bVar1 = needSwapEndian(in_RDI);
    if (bVar1) {
      local_54 = readNextWithByteSwap<unsigned_int,unsigned_char>
                           ((uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
    }
    else {
      local_54 = readNext<unsigned_int,unsigned_char>
                           ((uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
    }
    in_RDI->m_extTreeOffset = local_54;
    bVar1 = needSwapEndian(in_RDI);
    if (bVar1) {
      local_58 = readNextWithByteSwap<unsigned_int,unsigned_char>
                           ((uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
    }
    else {
      local_58 = readNext<unsigned_int,unsigned_char>
                           ((uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
    }
    in_RDI->m_nodeTreeOffset = local_58;
    bVar1 = needSwapEndian(in_RDI);
    if (bVar1) {
      uVar2 = readNextWithByteSwap<unsigned_int,unsigned_char>
                        ((uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    else {
      uVar2 = readNext<unsigned_int,unsigned_char>
                        ((uchar **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    in_RDI->m_entryTreeCount = uVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (in_stack_ffffffffffffffc0,(size_type)in_RDI);
    local_28 = &in_RDI->m_entryTreeOffsets;
    local_30._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (in_stack_ffffffffffffff98);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_30);
      bVar1 = needSwapEndian(in_RDI);
      if (bVar1) {
        in_stack_ffffffffffffffa0 =
             readNextWithByteSwap<unsigned_int,unsigned_char>
                       ((uchar **)CONCAT44(uVar2,in_stack_ffffffffffffffa0));
      }
      else {
        in_stack_ffffffffffffffa0 =
             readNext<unsigned_int,unsigned_char>
                       ((uchar **)CONCAT44(uVar2,in_stack_ffffffffffffffa0));
      }
      *puVar3 = in_stack_ffffffffffffffa0;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_30);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VolumeFile::parseSegment()
{
	const auto* p = m_data.data();

	const auto segmentMagic = VOLUME_READ_NEXT_SELF(p, uint32_t);
	if (segmentMagic != SEGMENT_MAGIC) {
		return false;
	}

	m_nameTreeOffset = VOLUME_READ_NEXT_SELF(p, uint32_t);
	m_extTreeOffset = VOLUME_READ_NEXT_SELF(p, uint32_t);
	m_nodeTreeOffset = VOLUME_READ_NEXT_SELF(p, uint32_t);
	m_entryTreeCount = VOLUME_READ_NEXT_SELF(p, uint32_t);

	m_entryTreeOffsets.resize(m_entryTreeCount);
	for (auto& offset: m_entryTreeOffsets) {
		offset = VOLUME_READ_NEXT_SELF(p, uint32_t);
	}

	return true;
}